

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O3

bool tinyusdz::anon_unknown_27::ParseUSDZHeader
               (uint8_t *addr,size_t length,
               vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
               *assets,string *warn,string *err)

{
  ulong *puVar1;
  ulong uVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ushort uVar4;
  uint uVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  *this;
  char cVar10;
  int *piVar11;
  long *plVar12;
  long *plVar13;
  ulong uVar14;
  char cVar15;
  ulong __val;
  bool bVar16;
  USDZAssetInfo info;
  string varname;
  value_type local_d0;
  uint8_t *local_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  *local_78;
  long *local_70;
  uint local_68;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_a0 = addr;
  if ((addr == (uint8_t *)0x0) || (length < 0x76)) {
    if (warn != (string *)0x0) {
      ::std::__cxx11::string::append((char *)warn);
    }
LAB_00121a1d:
    bVar16 = false;
  }
  else {
    __val = 0;
    local_78 = assets;
    do {
      uVar14 = __val + 0x1e;
      bVar16 = length <= uVar14;
      if (bVar16) {
        return true;
      }
      piVar11 = (int *)operator_new(0x1e);
      uVar7 = *(undefined8 *)(local_a0 + __val + 8);
      uVar8 = *(undefined8 *)(local_a0 + __val + 0xe);
      uVar9 = *(undefined8 *)(local_a0 + __val + 0xe + 8);
      *(undefined8 *)piVar11 = *(undefined8 *)(local_a0 + __val);
      *(undefined8 *)(piVar11 + 2) = uVar7;
      *(undefined8 *)((long)piVar11 + 0xe) = uVar8;
      *(undefined8 *)((long)piVar11 + 0x16) = uVar9;
      if (*piVar11 != 0x4034b50) {
        if (__val != 0) {
          operator_delete(piVar11,0x1e);
          return true;
        }
joined_r0x00121dd1:
        if (warn != (string *)0x0) {
          ::std::__cxx11::string::append((char *)warn);
        }
        operator_delete(piVar11,0x1e);
        goto LAB_00121a1d;
      }
      uVar4 = *(ushort *)((long)piVar11 + 0x1a);
      uVar2 = uVar14 + uVar4;
      if (length < uVar2) goto joined_r0x00121dd1;
      local_50[0] = local_40;
      ::std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar4);
      memcpy(local_50[0],local_a0 + uVar14,(ulong)uVar4);
      this = local_78;
      __val = *(ushort *)(piVar11 + 7) + uVar2;
      if (length < __val) {
        if (warn != (string *)0x0) {
          ::std::__cxx11::string::append((char *)warn);
        }
        bVar6 = false;
        __val = uVar2;
      }
      else {
        if ((__val & 0x3f) == 0) {
          if ((short)piVar11[2] == 0) {
            uVar5 = *(uint *)((long)piVar11 + 0x16);
            if (local_78 !=
                (vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                 *)0x0) {
              local_d0.filename._M_dataplus._M_p = (pointer)&local_d0.filename.field_2;
              local_d0.filename._M_string_length = 0;
              local_d0.filename.field_2._M_allocated_capacity =
                   local_d0.filename.field_2._M_allocated_capacity & 0xffffffffffffff00;
              ::std::__cxx11::string::_M_assign((string *)&local_d0);
              local_d0.byte_end = __val + uVar5;
              local_d0.byte_begin = __val;
              std::
              vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
              ::push_back(this,&local_d0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0.filename._M_dataplus._M_p != &local_d0.filename.field_2) {
                operator_delete(local_d0.filename._M_dataplus._M_p,
                                local_d0.filename.field_2._M_allocated_capacity + 1);
              }
            }
            __val = __val + uVar5;
            bVar6 = true;
            goto LAB_00121d5f;
          }
          if (warn != (string *)0x0) {
            ::std::__cxx11::string::append((char *)warn);
          }
        }
        else if (warn != (string *)0x0) {
          cVar15 = '\x01';
          if (9 < __val) {
            uVar14 = __val;
            cVar10 = '\x04';
            do {
              cVar15 = cVar10;
              if (uVar14 < 100) {
                cVar15 = cVar15 + -2;
                goto LAB_00121c1f;
              }
              if (uVar14 < 1000) {
                cVar15 = cVar15 + -1;
                goto LAB_00121c1f;
              }
              if (uVar14 < 10000) goto LAB_00121c1f;
              bVar6 = 99999 < uVar14;
              uVar14 = uVar14 / 10000;
              cVar10 = cVar15 + '\x04';
            } while (bVar6);
            cVar15 = cVar15 + '\x01';
          }
LAB_00121c1f:
          local_70 = local_60;
          ::std::__cxx11::string::_M_construct((ulong)&local_70,cVar15);
          std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_70,local_68,__val);
          plVar12 = (long *)::std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x3948fb)
          ;
          local_98 = &local_88;
          plVar13 = plVar12 + 2;
          if ((long *)*plVar12 == plVar13) {
            local_88 = *plVar13;
            lStack_80 = plVar12[3];
          }
          else {
            local_88 = *plVar13;
            local_98 = (long *)*plVar12;
          }
          local_90 = plVar12[1];
          *plVar12 = (long)plVar13;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar13 = (long *)::std::__cxx11::string::append((char *)&local_98);
          paVar3 = &local_d0.filename.field_2;
          puVar1 = (ulong *)(plVar13 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar1) {
            local_d0.filename.field_2._M_allocated_capacity = *puVar1;
            local_d0.filename.field_2._8_8_ = plVar13[3];
            local_d0.filename._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_d0.filename.field_2._M_allocated_capacity = *puVar1;
            local_d0.filename._M_dataplus._M_p = (pointer)*plVar13;
          }
          local_d0.filename._M_string_length = plVar13[1];
          *plVar13 = (long)puVar1;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)warn,(ulong)local_d0.filename._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0.filename._M_dataplus._M_p != paVar3) {
            operator_delete(local_d0.filename._M_dataplus._M_p,
                            local_d0.filename.field_2._M_allocated_capacity + 1);
          }
          if (local_98 != &local_88) {
            operator_delete(local_98,local_88 + 1);
          }
          if (local_70 != local_60) {
            operator_delete(local_70,local_60[0] + 1);
          }
        }
        bVar6 = false;
      }
LAB_00121d5f:
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      operator_delete(piVar11,0x1e);
    } while (bVar6);
  }
  return bVar16;
}

Assistant:

bool ParseUSDZHeader(const uint8_t *addr, const size_t length,
                     std::vector<USDZAssetInfo> *assets, std::string *warn,
                     std::string *err) {
  (void)warn;

  if (!addr) {
    if (err) {
      (*err) += "null for `addr` argument.\n";
    }
    return false;
  }

  if (length < (11 * 8) + 30) {  // 88 for USDC header, 30 for ZIP header
    // ???
    if (err) {
      (*err) += "File size too short. Looks like this file is not a USDZ\n";
    }
    return false;
  }

  size_t offset = 0;
  while ((offset + 30) < length) {
    //
    // PK zip format:
    // https://users.cs.jmu.edu/buchhofp/forensics/formats/pkzip.html
    //
    std::vector<char> local_header(30);
    memcpy(local_header.data(), addr + offset, 30);

    // Check signagure(first 4 bytes)
    // Must be \x50\x4b\x03\x04
    if ((local_header[0] == 0x50) && (local_header[1] == 0x4b) &&
        (local_header[2] == 0x03) && (local_header[3] == 0x04)) {
      // ok

      // TODO: Check other header info(version, flags, crc32)
    } else {
      if (offset == 0) {
        // Invalid header found.
        if (err) {
          (*err) += "PKZIP header not found.\n";
        }
        return false;
      } else {
        // not a local(global?) header
        // Maybe near to the end of file.
        break;
      }
    }

    offset += 30;

    // read in the variable name
    uint16_t name_len;
    memcpy(&name_len, &local_header[26], sizeof(uint16_t));
    if ((offset + name_len) > length) {
      if (err) {
        (*err) += "Invalid ZIP data\n";
      }
      return false;
    }

    std::string varname(name_len, ' ');
    memcpy(&varname[0], addr + offset, name_len);

    offset += name_len;

    // read in the extra field
    uint16_t extra_field_len;
    memcpy(&extra_field_len, &local_header[28], sizeof(uint16_t));
    if (extra_field_len > 0) {
      if (offset + extra_field_len > length) {
        if (err) {
          (*err) += "Invalid extra field length in ZIP data\n";
        }
        return false;
      }
    }

    offset += extra_field_len;

    // In usdz, data must be aligned at 64bytes boundary.
    if ((offset % 64) != 0) {
      if (err) {
        (*err) += "Data offset must be mulitple of 64bytes for USDZ, but got " +
                  std::to_string(offset) + ".\n";
      }
      return false;
    }

    uint16_t compr_method = *reinterpret_cast<uint16_t *>(&local_header[0] + 8);
    // uint32_t compr_bytes = *reinterpret_cast<uint32_t*>(&local_header[0]+18);
    uint32_t uncompr_bytes;
    memcpy(&uncompr_bytes, &local_header[22], sizeof(uncompr_bytes));

    // USDZ only supports uncompressed ZIP
    if (compr_method != 0) {
      if (err) {
        (*err) += "Compressed ZIP is not supported for USDZ\n";
      }
      return false;
    }

    if (assets) {
      USDZAssetInfo info;
      DCOUT("USDZasset[" << assets->size() << "] " << varname << ", byte_begin " << offset << ", length " << uncompr_bytes << "\n");
      info.filename = varname;
      info.byte_begin = offset;
      info.byte_end = offset + uncompr_bytes;

      assets->push_back(info);
    }

    offset += uncompr_bytes;
  }

  return true;
}